

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VideoEngine.cpp
# Opt level: O1

Expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* shaderPreprocessor_abi_cxx11_
            (Expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,Source *flat)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  Type TVar3;
  pointer pCVar4;
  Expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *pEVar5;
  size_type sVar6;
  _Base_ptr p_Var7;
  pointer pCVar8;
  _Rb_tree_header *p_Var9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string source;
  string local_a0;
  undefined1 *local_80;
  size_type local_78;
  undefined1 local_70;
  undefined7 uStack_6f;
  undefined8 uStack_68;
  Expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  Source *local_38;
  
  local_80 = &local_70;
  local_78 = 0;
  local_70 = 0;
  if (flat->version_ != 0) {
    format_abi_cxx11_(&local_a0,"#version %d\n");
    std::__cxx11::string::operator=((string *)&local_80,(string *)&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
      operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
    }
  }
  p_Var7 = (flat->uniforms_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var9 = &(flat->uniforms_)._M_t._M_impl.super__Rb_tree_header;
  local_60 = __return_storage_ptr__;
  local_38 = flat;
  if ((_Rb_tree_header *)p_Var7 != p_Var9) {
    do {
      if (p_Var7[2]._M_color - _S_black < 4) {
        std::__cxx11::string::append((char *)&local_80);
      }
      local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_a0,*(long *)(p_Var7 + 1),
                 (long)&(p_Var7[1]._M_parent)->_M_color + *(long *)(p_Var7 + 1));
      std::__cxx11::string::append((char *)&local_a0);
      std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_a0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
      }
      p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
    } while ((_Rb_tree_header *)p_Var7 != p_Var9);
  }
  pCVar8 = (local_38->chunks_).
           super__Vector_base<shader::Source::Chunk,_std::allocator<shader::Source::Chunk>_>._M_impl
           .super__Vector_impl_data._M_start;
  pCVar4 = (local_38->chunks_).
           super__Vector_base<shader::Source::Chunk,_std::allocator<shader::Source::Chunk>_>._M_impl
           .super__Vector_impl_data._M_finish;
  if (pCVar8 != pCVar4) {
    do {
      TVar3 = pCVar8->type;
      if ((TVar3 == String) || (TVar3 == Uniform)) {
        std::__cxx11::string::_M_append((char *)&local_80,(ulong)(pCVar8->value)._M_dataplus._M_p);
      }
      else if (TVar3 == Include) {
        local_58 = &local_48;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,"Include chunk is invalid in flat shader source","");
        sVar6 = local_50;
        paVar1 = &local_a0.field_2;
        if (local_58 == &local_48) {
          local_a0.field_2._8_8_ = local_48._8_8_;
          local_a0._M_dataplus._M_p = (pointer)paVar1;
        }
        else {
          local_a0._M_dataplus._M_p = (pointer)local_58;
        }
        local_a0.field_2._M_allocated_capacity._1_7_ = local_48._M_allocated_capacity._1_7_;
        local_a0.field_2._M_local_buf[0] = local_48._M_local_buf[0];
        local_50 = 0;
        local_48._M_local_buf[0] = '\0';
        paVar2 = &(local_60->field_0).error_.error_.field_2;
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)&local_60->field_0 = paVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a0._M_dataplus._M_p == paVar1) {
          paVar2->_M_allocated_capacity = local_a0.field_2._M_allocated_capacity;
          *(undefined8 *)((long)&(local_60->field_0).error_.error_.field_2 + 8) =
               local_a0.field_2._8_8_;
        }
        else {
          (local_60->field_0).value_._M_dataplus._M_p = local_a0._M_dataplus._M_p;
          (local_60->field_0).error_.error_.field_2._M_allocated_capacity =
               local_a0.field_2._M_allocated_capacity;
        }
        (local_60->field_0).value_._M_string_length = sVar6;
        local_a0._M_string_length = 0;
        local_a0.field_2._M_allocated_capacity =
             (ulong)(uint7)local_48._M_allocated_capacity._1_7_ << 8;
        local_60->has_value_ = false;
        local_a0._M_dataplus._M_p = (pointer)paVar1;
        local_58 = &local_48;
        goto LAB_0014334c;
      }
      pCVar8 = pCVar8 + 1;
    } while (pCVar8 != pCVar4);
  }
  paVar1 = &(local_60->field_0).error_.error_.field_2;
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)&local_60->field_0 = paVar1;
  if (local_80 == &local_70) {
    paVar1->_M_allocated_capacity = CONCAT71(uStack_6f,local_70);
    *(undefined8 *)((long)&(local_60->field_0).error_.error_.field_2 + 8) = uStack_68;
  }
  else {
    *(undefined1 **)&local_60->field_0 = local_80;
    (local_60->field_0).error_.error_.field_2._M_allocated_capacity = CONCAT71(uStack_6f,local_70);
  }
  (local_60->field_0).value_._M_string_length = local_78;
  local_78 = 0;
  local_70 = 0;
  local_60->has_value_ = true;
  local_80 = &local_70;
LAB_0014334c:
  pEVar5 = local_60;
  if (local_80 != &local_70) {
    operator_delete(local_80,CONCAT71(uStack_6f,local_70) + 1);
  }
  return pEVar5;
}

Assistant:

static Expected<std::string, std::string> shaderPreprocessor(const shader::Source &flat) {
	std::string source;
	if (flat.version() != 0)
		source = format("#version %d\n", flat.version());
	for (const auto &[name, decl]: flat.uniforms()) {
		switch(decl.type) {
			case shader::UniformType::Float:
				source += "uniform float ";
				break;
			case shader::UniformType::Vec2:
				source += "uniform vec2 ";
				break;
			case shader::UniformType::Vec3:
				source += "uniform vec3 ";
				break;
			case shader::UniformType::Vec4:
				source += "uniform vec4 ";
				break;
		}
		source += name + ";";
	}

	for (const auto &chunk: flat.chunks()) {
		switch (chunk.type) {
			case shader::Source::Chunk::Type::Uniform:
			case shader::Source::Chunk::Type::String:
				source += chunk.value;
				break;
			case shader::Source::Chunk::Type::Include:
				return Unexpected<std::string>("Include chunk is invalid in flat shader source");
		}
	}

	return Expected<std::string, std::string>(std::move(source));
}